

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eccommit_impl.h
# Opt level: O0

int secp256k1_ec_commit_verify
              (secp256k1_ge *commitp,secp256k1_ge *pubp,secp256k1_sha256 *sha,uchar *data,
              size_t data_size)

{
  int iVar1;
  secp256k1_ge p;
  secp256k1_gej pj;
  secp256k1_ge *in_stack_fffffffffffffec8;
  secp256k1_gej *in_stack_fffffffffffffed0;
  size_t in_stack_fffffffffffffef0;
  uchar *in_stack_fffffffffffffef8;
  secp256k1_sha256 *in_stack_ffffffffffffff00;
  secp256k1_ge *in_stack_ffffffffffffff08;
  secp256k1_ge *in_stack_ffffffffffffff10;
  undefined4 local_4;
  
  iVar1 = secp256k1_ec_commit(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
                              in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,
                              in_stack_fffffffffffffef0);
  if (iVar1 == 0) {
    local_4 = 0;
  }
  else {
    secp256k1_ge_neg((secp256k1_ge *)in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
    secp256k1_gej_set_ge(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
    secp256k1_gej_add_ge_var
              ((secp256k1_gej *)pj.y.n[4],(secp256k1_gej *)pj.y.n[3],(secp256k1_ge *)pj.y.n[2],
               (secp256k1_fe *)pj.y.n[1]);
    local_4 = secp256k1_gej_is_infinity((secp256k1_gej *)0x14a98a);
  }
  return local_4;
}

Assistant:

static int secp256k1_ec_commit_verify(const secp256k1_ge* commitp, const secp256k1_ge* pubp, secp256k1_sha256* sha, const unsigned char *data, size_t data_size) {
    secp256k1_gej pj;
    secp256k1_ge p;

    if (!secp256k1_ec_commit(&p, pubp, sha, data, data_size)) {
        return 0;
    }

    /* Return p == commitp */
    secp256k1_ge_neg(&p, &p);
    secp256k1_gej_set_ge(&pj, &p);
    secp256k1_gej_add_ge_var(&pj, &pj, commitp, NULL);
    return secp256k1_gej_is_infinity(&pj);
}